

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnRefFuncExpr(BinaryReaderIR *this,Index func_index)

{
  undefined4 index;
  Result RVar1;
  undefined1 local_a0 [16];
  undefined1 local_90 [40];
  Var local_68;
  
  local_a0._12_4_ = func_index;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&this->module_->used_func_refs,(uint *)(local_a0 + 0xc));
  index = local_a0._12_4_;
  GetLocation((Location *)(local_90 + 8),this);
  Var::Var(&local_68,index,(Location *)(local_90 + 8));
  std::make_unique<wabt::VarExpr<(wabt::ExprType)36>,wabt::Var>((Var *)local_a0);
  local_90._0_8_ = local_a0._0_8_;
  local_a0._0_8_ = (long *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)local_90);
  if (local_90._0_8_ != 0) {
    (**(code **)(*(long *)local_90._0_8_ + 8))();
  }
  if ((long *)local_a0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a0._0_8_ + 8))();
  }
  local_a0._0_8_ = 0;
  Var::~Var(&local_68);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnRefFuncExpr(Index func_index) {
  module_->used_func_refs.insert(func_index);
  return AppendExpr(
      std::make_unique<RefFuncExpr>(Var(func_index, GetLocation())));
}